

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

ValueFederate * __thiscall helics::ValueFederate::operator=(ValueFederate *this,ValueFederate *fed)

{
  pointer __p;
  
  __p = (fed->vfManager)._M_t.
        super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
        ._M_t.
        super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
        .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl;
  (fed->vfManager)._M_t.
  super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl =
       (ValueFederateManager *)0x0;
  std::
  __uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ::reset((__uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
           *)&this->vfManager,__p);
  if (*(int *)(&this->field_0x10 + (long)this->_vptr_ValueFederate[-3]) !=
      *(int *)(&fed->field_0x10 + (long)fed->_vptr_ValueFederate[-3])) {
    Federate::operator=((Federate *)
                        ((long)&this->_vptr_ValueFederate + (long)this->_vptr_ValueFederate[-3]),
                        (Federate *)
                        ((long)&fed->_vptr_ValueFederate + (long)fed->_vptr_ValueFederate[-3]));
  }
  return this;
}

Assistant:

ValueFederate& ValueFederate::operator=(ValueFederate&& fed) noexcept
{
    vfManager = std::move(fed.vfManager);
    if (getID() != fed.getID()) {  // the id won't be moved, as it is copied so use it as a test if
                                   // it has moved already
        Federate::operator=(std::move(fed));
    }
    return *this;
}